

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O1

void __thiscall QScrollBar::contextMenuEvent(QScrollBar *this,QContextMenuEvent *event)

{
  int iVar1;
  QStyle *pQVar2;
  QWidget *this_00;
  
  pQVar2 = QWidget::style((QWidget *)this);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x3e,0,this,0);
  if (iVar1 != 0) {
    this_00 = &createStandardContextMenu(this,*(QPoint *)(event + 0x28))->super_QWidget;
    QWidget::setAttribute(this_00,WA_DeleteOnClose,true);
    QMenu::popup((QMenu *)this_00,(QPoint *)(event + 0x30),(QAction *)0x0);
    return;
  }
  QWidget::contextMenuEvent((QWidget *)this,event);
  return;
}

Assistant:

void QScrollBar::contextMenuEvent(QContextMenuEvent *event)
{
    if (!style()->styleHint(QStyle::SH_ScrollBar_ContextMenu, nullptr, this)) {
        QAbstractSlider::contextMenuEvent(event);
        return;
    }

#if QT_CONFIG(menu)
    QMenu *menu = createStandardContextMenu(event->pos());
    if (!menu)
        return;

    menu->setAttribute(Qt::WA_DeleteOnClose);
    menu->popup(event->globalPos());
#else
    Q_UNUSED(pos)
#endif
}